

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_parser_test.cpp
# Opt level: O3

void __thiscall
bioparser::test::BioparserPafTest_CompressedParseInChunks_Test::
~BioparserPafTest_CompressedParseInChunks_Test(BioparserPafTest_CompressedParseInChunks_Test *this)

{
  Parser<bioparser::test::PafOverlap> *pPVar1;
  
  (this->super_BioparserPafTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BioparserPafTest_00158a18;
  std::
  vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  ::~vector(&(this->super_BioparserPafTest).o);
  pPVar1 = (this->super_BioparserPafTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<bioparser::test::PafOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::PafOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>_>
           .super__Head_base<0UL,_bioparser::Parser<bioparser::test::PafOverlap>_*,_false>.
           _M_head_impl;
  if (pPVar1 != (Parser<bioparser::test::PafOverlap> *)0x0) {
    (*pPVar1->_vptr_Parser[1])();
  }
  (this->super_BioparserPafTest).p._M_t.
  super___uniq_ptr_impl<bioparser::Parser<bioparser::test::PafOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::PafOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>_>
  .super__Head_base<0UL,_bioparser::Parser<bioparser::test::PafOverlap>_*,_false>._M_head_impl =
       (Parser<bioparser::test::PafOverlap> *)0x0;
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserPafTest, CompressedParseInChunks) {
  Setup("sample.paf.gz");
  for (auto t = p->Parse(1024); !t.empty(); t = p->Parse(1024)) {
    o.insert(
        o.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}